

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O2

int KYBER_parse_public_key(KYBER_public_key *public_key,CBS *in)

{
  uint8_t *in_00;
  size_t len;
  int iVar1;
  int iVar2;
  
  in_00 = in->data;
  len = in->len;
  iVar1 = kyber_parse_public_key_no_hash((public_key *)public_key,in);
  iVar2 = 0;
  if ((iVar1 != 0) && (in->len == 0)) {
    hash_h((public_key->opaque).bytes + 0x620,in_00,len);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int KYBER_parse_public_key(struct KYBER_public_key *public_key, CBS *in) {
  struct public_key *pub = public_key_from_external(public_key);
  CBS orig_in = *in;
  if (!kyber_parse_public_key_no_hash(pub, in) ||  //
      CBS_len(in) != 0) {
    return 0;
  }
  hash_h(pub->public_key_hash, CBS_data(&orig_in), CBS_len(&orig_in));
  return 1;
}